

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O0

int Extra_bddSuppOverlapping(DdManager *dd,DdNode *S1,DdNode *S2)

{
  bool bVar1;
  DdNode *local_28;
  DdNode *S2_local;
  DdNode *S1_local;
  DdManager *dd_local;
  
  local_28 = S2;
  S2_local = S1;
  while( true ) {
    bVar1 = false;
    if (S2_local->index != 0x7fffffff) {
      bVar1 = local_28->index != 0x7fffffff;
    }
    if (!bVar1) break;
    if (S2_local->index == local_28->index) {
      return 1;
    }
    if (dd->perm[S2_local->index] < dd->perm[local_28->index]) {
      S2_local = (S2_local->type).kids.T;
    }
    else {
      local_28 = (local_28->type).kids.T;
    }
  }
  return 0;
}

Assistant:

int Extra_bddSuppOverlapping( DdManager * dd, DdNode * S1, DdNode * S2 )
{
    while ( S1->index != CUDD_CONST_INDEX && S2->index != CUDD_CONST_INDEX )
    {
        // if the top vars are the same, they intersect
        if ( S1->index == S2->index )
            return 1;
        // if the top vars are different, skip the one, which is higher
        if ( dd->perm[S1->index] < dd->perm[S2->index] )
            S1 = cuddT(S1);
        else
            S2 = cuddT(S2);
    }
    return 0;
}